

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

UninterpretedOption * __thiscall
google::protobuf::UninterpretedOption::New(UninterpretedOption *this,Arena *arena)

{
  UninterpretedOption *this_00;
  UninterpretedOption *n;
  Arena *arena_local;
  UninterpretedOption *this_local;
  
  this_00 = (UninterpretedOption *)operator_new(0x60);
  UninterpretedOption(this_00);
  if (arena != (Arena *)0x0) {
    Arena::Own<google::protobuf::UninterpretedOption>(arena,this_00);
  }
  return this_00;
}

Assistant:

UninterpretedOption* UninterpretedOption::New(::google::protobuf::Arena* arena) const {
  UninterpretedOption* n = new UninterpretedOption;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}